

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O2

void ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  BYTE **ppBVar1;
  ZSTD_strategy ZVar2;
  BYTE *pBVar3;
  U32 UVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  U32 *pUVar12;
  long lVar13;
  uint uVar14;
  
  pBVar3 = (ms->window).base;
  iVar7 = (int)pBVar3;
  if (0xe0000000 < (uint)((int)iend - iVar7)) {
    uVar8 = 1 << ((byte)(params->cParams).windowLog & 0x1f);
    uVar10 = 1 << ((char)(params->cParams).chainLog - (ZSTD_lazy2 < (params->cParams).strategy) &
                  0x1fU);
    uVar14 = (int)ip - iVar7;
    uVar6 = uVar10 - 1 & uVar14;
    if (uVar6 == 0) {
      uVar6 = uVar10;
    }
    if (uVar10 <= uVar8) {
      uVar10 = uVar8;
    }
    uVar14 = uVar14 - (uVar10 + uVar6);
    (ms->window).base = pBVar3 + uVar14;
    ppBVar1 = &(ms->window).dictBase;
    *ppBVar1 = *ppBVar1 + uVar14;
    uVar6 = (ms->window).lowLimit;
    UVar4 = uVar6 - uVar14;
    if (uVar6 < uVar14 || UVar4 == 0) {
      UVar4 = 1;
    }
    uVar6 = (ms->window).dictLimit;
    (ms->window).lowLimit = UVar4;
    UVar4 = uVar6 - uVar14;
    if (uVar6 < uVar14 || UVar4 == 0) {
      UVar4 = 1;
    }
    (ms->window).dictLimit = UVar4;
    pUVar12 = &(ms->window).nbOverflowCorrections;
    *pUVar12 = *pUVar12 + 1;
    ws->tableValidEnd = ws->objectEnd;
    ZSTD_reduceTable(ms->hashTable,1 << ((byte)(params->cParams).hashLog & 0x1f),uVar14);
    ZVar2 = (params->cParams).strategy;
    if ((ms->dedicatedDictSearch != 0) ||
       ((ZVar2 != ZSTD_fast &&
        ((2 < ZVar2 - ZSTD_greedy || (params->useRowMatchFinder != ZSTD_urm_enableRowMatchFinder))))
       )) {
      UVar4 = 1 << ((byte)(params->cParams).chainLog & 0x1f);
      pUVar12 = ms->chainTable;
      if (ZVar2 == ZSTD_btlazy2) {
        iVar7 = 0x10;
        iVar5 = (int)UVar4 / 0x10;
        lVar9 = 0;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        for (iVar11 = 0; iVar11 != iVar5; iVar11 = iVar11 + 1) {
          for (lVar13 = 0; iVar7 + lVar9 != lVar13; lVar13 = lVar13 + 1) {
            uVar6 = uVar14;
            if (pUVar12[lVar13] != 1) {
              uVar6 = 0;
            }
            uVar6 = uVar6 + pUVar12[lVar13];
            UVar4 = uVar6 - uVar14;
            if (uVar6 < uVar14) {
              UVar4 = 0;
            }
            pUVar12[lVar13] = UVar4;
          }
          pUVar12 = pUVar12 + 0x10;
          lVar9 = lVar9 + -0x10;
          iVar7 = iVar7 + 0x10;
        }
      }
      else {
        ZSTD_reduceTable(pUVar12,UVar4,uVar14);
      }
    }
    if (ms->hashLog3 != 0) {
      ZSTD_reduceTable(ms->hashTable3,1 << ((byte)ms->hashLog3 & 0x1f),uVar14);
    }
    if (ws->tableValidEnd < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
    UVar4 = ms->nextToUpdate - uVar14;
    if (ms->nextToUpdate < uVar14) {
      UVar4 = 0;
    }
    ms->nextToUpdate = UVar4;
    ms->loadedDictEnd = 0;
    ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

MEM_STATIC U32 ZSTD_window_needOverflowCorrection(ZSTD_window_t const window,
                                                  U32 cycleLog,
                                                  U32 maxDist,
                                                  U32 loadedDictEnd,
                                                  void const* src,
                                                  void const* srcEnd)
{
    U32 const curr = (U32)((BYTE const*)srcEnd - window.base);
    if (ZSTD_WINDOW_OVERFLOW_CORRECT_FREQUENTLY) {
        if (ZSTD_window_canOverflowCorrect(window, cycleLog, maxDist, loadedDictEnd, src)) {
            return 1;
        }
    }
    return curr > ZSTD_CURRENT_MAX;
}